

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

int __thiscall ncnn::Slice::load_param(Slice *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  long in_RDI;
  Mat *m;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  ParamDict *in_stack_ffffffffffffff78;
  
  this_00 = (Mat *)&stack0xffffffffffffff70;
  m = in_RSI;
  Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  Mat::operator=(this_00,m);
  Mat::~Mat((Mat *)0x173d98);
  Mat::~Mat((Mat *)0x173da2);
  iVar1 = ParamDict::get((ParamDict *)in_RSI,1,0);
  *(int *)(in_RDI + 0xf8) = iVar1;
  return 0;
}

Assistant:

int Slice::load_param(const ParamDict& pd)
{
    slices = pd.get(0, Mat());
    axis = pd.get(1, 0);

    return 0;
}